

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::LifetimeTests::details::ShaderProgramInputAttacher::drawContainer
          (ShaderProgramInputAttacher *this,GLuint program,Surface *dst)

{
  ContextWrapper *this_00;
  ostringstream *poVar1;
  RenderContext *renderCtx;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  TestError *pTVar4;
  Rectangle viewport;
  Random rnd;
  GLint linkStatus;
  CheckedShader vtxShader;
  Rectangle local_230;
  deRandom local_220;
  undefined1 local_210 [120];
  ios_base local_198 [264];
  Shader local_90;
  
  deRandom_init(&local_220,program);
  renderCtx = (this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx;
  local_210._0_8_ = local_210 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_210,
             "#version 100\nattribute vec2 pos; void main() { gl_Position = vec4(pos.xy, 0.0, 1.0); }\n"
             ,"");
  CheckedShader::CheckedShader
            ((CheckedShader *)&local_90,renderCtx,SHADERTYPE_VERTEX,(string *)local_210);
  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  local_230 = randomViewport((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx,0x80
                             ,0x80,(Random *)&local_220);
  iVar2 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x10))(program,local_90.m_shader);
  iVar2 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0xce8))(program);
  local_210._0_8_ = local_210._0_8_ & 0xffffffff00000000;
  iVar2 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar2) + 0x9d8))(program,0x8b82,local_210);
  if (local_210._0_4_ != 0) {
    local_210._0_8_ = ((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_210 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// Attached a temporary vertex shader and linked program ",0x39);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_210,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_198);
    iVar2 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_02,iVar2) + 0x1a00))
              (local_230.x,local_230.y,local_230.width,local_230.height);
    local_210._0_8_ = ((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_210 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// Positioned viewport randomly",0x1f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_210,(EndMessageToken *)&tcu::TestLog::EndMessage);
    this_00 = &(this->super_InputAttacher).super_ContextWrapper;
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_198);
    glu::CallLogWrapper::glUseProgram(&this_00->super_CallLogWrapper,program);
    iVar2 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
              _vptr_RenderContext[3])();
    iVar2 = (**(code **)(CONCAT44(extraout_var_03,iVar2) + 0x780))(program);
    if (-1 < iVar2) {
      iVar3 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
                _vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_04,iVar3) + 0x610))(iVar2);
      iVar3 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
                _vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_05,iVar3) + 0x1c0))(0,0,0,0x3f800000);
      iVar3 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
                _vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_06,iVar3) + 0x188))(0x4100);
      iVar3 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
                _vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_07,iVar3) + 0x19f0))
                (iVar2,2,0x1406,0,0,drawContainer::s_vertices);
      iVar3 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
                _vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_08,iVar3) + 0x538))(4,0,3);
      iVar3 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
                _vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_09,iVar3) + 0x518))(iVar2);
      local_210._0_8_ = ((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_210 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"// Drew a fixed triangle",0x18);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_210,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_198);
      glu::CallLogWrapper::glUseProgram(&this_00->super_CallLogWrapper,0);
      readRectangle((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx,&local_230,
                    dst);
      local_210._0_8_ = ((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_210 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"// Copied viewport to output image",0x22);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_210,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_198);
      iVar2 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
                _vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_10,iVar2) + 0x4e0))(program,local_90.m_shader);
      local_210._0_8_ = ((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_210 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"// Removed temporary vertex shader",0x22);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_210,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_198);
      glu::Shader::~Shader(&local_90);
      return;
    }
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,(char *)0x0,"posLoc >= 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
               ,0x217);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar4,(char *)0x0,"linkStatus != 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
             ,0x20a);
  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderProgramInputAttacher::drawContainer (GLuint program, Surface& dst)
{
	static const float	s_vertices[6]	= { -1.0, 0.0, 1.0, 1.0, 0.0, -1.0 };
	Random				rnd				(program);
	CheckedShader		vtxShader		(getRenderContext(),
										 SHADERTYPE_VERTEX, s_vertexShaderSrc);
	const Rectangle		viewport		= randomViewport(getRenderContext(),
														 VIEWPORT_SIZE, VIEWPORT_SIZE, rnd);

	gl().attachShader(program, vtxShader.getShader());
	gl().linkProgram(program);

	{
		GLint linkStatus = 0;
		gl().getProgramiv(program, GL_LINK_STATUS, &linkStatus);
		TCU_CHECK(linkStatus != 0);
	}

	log() << TestLog::Message
		  << "// Attached a temporary vertex shader and linked program " << program
		  << TestLog::EndMessage;

	setViewport(getRenderContext(), viewport);
	log() << TestLog::Message << "// Positioned viewport randomly" << TestLog::EndMessage;

	glUseProgram(program);
	{
		GLint posLoc = gl().getAttribLocation(program, "pos");
		TCU_CHECK(posLoc >= 0);

		gl().enableVertexAttribArray(posLoc);

		gl().clearColor(0, 0, 0, 1);
		gl().clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl().vertexAttribPointer(posLoc, 2, GL_FLOAT, GL_FALSE, 0, s_vertices);
		gl().drawArrays(GL_TRIANGLES, 0, 3);

		gl().disableVertexAttribArray(posLoc);
		log () << TestLog::Message << "// Drew a fixed triangle" << TestLog::EndMessage;
	}
	glUseProgram(0);

	readRectangle(getRenderContext(), viewport, dst);
	log() << TestLog::Message << "// Copied viewport to output image" << TestLog::EndMessage;

	gl().detachShader(program, vtxShader.getShader());
	log() << TestLog::Message << "// Removed temporary vertex shader" << TestLog::EndMessage;
}